

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler.cpp
# Opt level: O1

void __thiscall LockstepScheduler::set_absolute_time(LockstepScheduler *this,uint64_t time_us)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator __position;
  unique_lock<std::mutex> lock_timed_waits;
  unique_lock<std::mutex> local_40;
  
  LOCK();
  (this->time_us_).super___atomic_base<unsigned_long>._M_i = time_us;
  UNLOCK();
  local_40._M_device = &this->timed_waits_mutex_;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  __position._M_current =
       (this->timed_waits_).
       super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (__position._M_current !=
      (this->timed_waits_).
      super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      peVar1 = ((__position._M_current)->
               super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = ((__position._M_current)->
                super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if (peVar1->done == true) {
        __position = std::
                     vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
                     ::_M_erase(&this->timed_waits_,__position);
      }
      else {
        if ((peVar1->time_us <= time_us) && (peVar1->timeout == false)) {
          peVar1->timeout = true;
          this->timed_waits_iterator_invalidated_ = false;
          pthread_mutex_lock((pthread_mutex_t *)peVar1->passed_lock);
          pthread_cond_broadcast((pthread_cond_t *)peVar1->passed_cond);
          pthread_mutex_unlock((pthread_mutex_t *)peVar1->passed_lock);
          if (this->timed_waits_iterator_invalidated_ == true) {
            __position._M_current =
                 (this->timed_waits_).
                 super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_00105d54;
          }
        }
        __position._M_current = __position._M_current + 1;
      }
LAB_00105d54:
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    } while (__position._M_current !=
             (this->timed_waits_).
             super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void LockstepScheduler::set_absolute_time(uint64_t time_us)
{
    time_us_ = time_us;

    {
        std::unique_lock<std::mutex> lock_timed_waits(timed_waits_mutex_);

        auto it = std::begin(timed_waits_);
        while (it != std::end(timed_waits_)) {

            std::shared_ptr<TimedWait> temp_timed_wait = *it;

            // Clean up the ones that are already done from last iteration.
            if (temp_timed_wait->done) {
                it = timed_waits_.erase(it);
                continue;
            }

            if (temp_timed_wait->time_us <= time_us &&
                    !temp_timed_wait->timeout &&
                    !temp_timed_wait->done) {
                temp_timed_wait->timeout = true;
                // We are abusing the condition here to signal that the time
                // has passed.
                timed_waits_iterator_invalidated_ = false;
                pthread_mutex_lock(temp_timed_wait->passed_lock);
                pthread_cond_broadcast(temp_timed_wait->passed_cond);
                pthread_mutex_unlock(temp_timed_wait->passed_lock);
                if (timed_waits_iterator_invalidated_) {
                    // The vector might have changed, we need to start from the
                    // beginning.
                    it = std::begin(timed_waits_);
                    continue;
                }
            }
            ++it;
        }
    }
}